

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_insert_face(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int local_3c;
  int local_34;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL reversed;
  REF_INT chunk;
  REF_INT orig;
  REF_INT face;
  REF_INT node;
  REF_INT *nodes_local;
  REF_CAVITY ref_cavity_local;
  
  _face = nodes;
  nodes_local = (REF_INT *)ref_cavity;
  uVar2 = ref_cavity_find_face(ref_cavity,nodes,&chunk,&local_34);
  if ((uVar2 == 0) || (uVar2 == 5)) {
    if (chunk == -1) {
      if (nodes_local[0xe] == -1) {
        reversed = nodes_local[0xd];
        if ((int)((double)reversed * 1.5) < 100) {
          local_3c = 100;
        }
        else {
          local_3c = (int)((double)reversed * 1.5);
        }
        ref_private_macro_code_rxs = local_3c;
        nodes_local[0xd] = reversed + local_3c;
        fflush(_stdout);
        if (0 < nodes_local[0xd] * 3) {
          pvVar3 = realloc(*(void **)(nodes_local + 0x10),(long)(nodes_local[0xd] * 3) << 2);
          *(void **)(nodes_local + 0x10) = pvVar3;
        }
        if (*(long *)(nodes_local + 0x10) == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x168,"ref_cavity_insert_face","realloc ref_cavity->f2n NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(nodes_local[0xd] * 3),(long)(nodes_local[0xd] * 3),4,
                 (long)(nodes_local[0xd] * 3) << 2);
          return 2;
        }
        for (chunk = reversed; chunk < nodes_local[0xd]; chunk = chunk + 1) {
          *(undefined4 *)(*(long *)(nodes_local + 0x10) + (long)(chunk * 3) * 4) = 0xffffffff;
          *(REF_INT *)(*(long *)(nodes_local + 0x10) + (long)(chunk * 3 + 1) * 4) = chunk + 1;
        }
        *(undefined4 *)(*(long *)(nodes_local + 0x10) + (long)((nodes_local[0xd] + -1) * 3 + 1) * 4)
             = 0xffffffff;
        nodes_local[0xe] = reversed;
      }
      iVar1 = nodes_local[0xe];
      nodes_local[0xe] = *(REF_INT *)(*(long *)(nodes_local + 0x10) + (long)(iVar1 * 3 + 1) * 4);
      for (orig = 0; orig < 3; orig = orig + 1) {
        *(REF_INT *)(*(long *)(nodes_local + 0x10) + (long)(orig + iVar1 * 3) * 4) = _face[orig];
      }
      nodes_local[0xc] = nodes_local[0xc] + 1;
      ref_cavity_local._4_4_ = 0;
    }
    else if (local_34 == 0) {
      if (nodes_local[0x1d] != 0) {
        printf("twice nodes[0] %f %f %f\n",
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(*_face * 0xf) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(*_face * 0xf + 1) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(*_face * 0xf + 2) * 8));
        printf("twice nodes[1] %f %f %f\n",
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[1] * 0xf) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[1] * 0xf + 1) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[1] * 0xf + 2) * 8));
        printf("twice nodes[2] %f %f %f\n",
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[2] * 0xf) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[2] * 0xf + 1) * 8),
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(nodes_local + 2) + 8) + 0x38) +
                (long)(_face[2] * 0xf + 2) * 8));
        ref_cavity_tec((REF_CAVITY)nodes_local,"cav-twice.tec");
      }
      ref_cavity_local._4_4_ = 3;
    }
    else {
      *(undefined4 *)(*(long *)(nodes_local + 0x10) + (long)(chunk * 3) * 4) = 0xffffffff;
      *(REF_INT *)(*(long *)(nodes_local + 0x10) + (long)(chunk * 3 + 1) * 4) = nodes_local[0xe];
      nodes_local[0xe] = chunk;
      nodes_local[0xc] = nodes_local[0xc] + -1;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x13c,
           "ref_cavity_insert_face",(ulong)uVar2,"find existing");
    ref_cavity_local._4_4_ = uVar2;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_face(REF_CAVITY ref_cavity,
                                          REF_INT *nodes) {
  REF_INT node, face;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_face(ref_cavity, nodes, &face, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != face) {
    if (reversed) { /* two faces with opposite orientation destroy each other */
      ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
      ref_cavity_f2n(ref_cavity, 1, face) = ref_cavity_blankface(ref_cavity);
      ref_cavity_blankface(ref_cavity) = face;
      ref_cavity_nface(ref_cavity)--;
      return REF_SUCCESS;
    } else { /* can't happen, added same face twice */
      if (ref_cavity_debug(ref_cavity)) {
        printf("twice nodes[0] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[0]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[0]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[0]));
        printf("twice nodes[1] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[1]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[1]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[1]));
        printf("twice nodes[2] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[2]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[2]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[2]));
        ref_cavity_tec(ref_cavity, "cav-twice.tec");
      }
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of faces */
  if (REF_EMPTY == ref_cavity_blankface(ref_cavity)) {
    orig = ref_cavity_maxface(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxface(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->f2n, 3 * ref_cavity_maxface(ref_cavity), REF_INT);

    for (face = orig; face < ref_cavity_maxface(ref_cavity); face++) {
      ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
      ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
    }
    ref_cavity_f2n(ref_cavity, 1, (ref_cavity->maxface) - 1) = REF_EMPTY;
    ref_cavity_blankface(ref_cavity) = orig;
  }

  face = ref_cavity_blankface(ref_cavity);
  ref_cavity_blankface(ref_cavity) = ref_cavity_f2n(ref_cavity, 1, face);
  for (node = 0; node < 3; node++)
    ref_cavity_f2n(ref_cavity, node, face) = nodes[node];

  ref_cavity_nface(ref_cavity)++;

  return REF_SUCCESS;
}